

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O2

SegmentBase<Memory::VirtualAllocWrapper> * __thiscall
DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,RealCount>::
PrependNode<Memory::NoThrowHeapAllocator,Memory::PageAllocatorBase<Memory::VirtualAllocWrapper,Memory::SegmentBase<Memory::VirtualAllocWrapper>,Memory::PageSegmentBase<Memory::VirtualAllocWrapper>>*,unsigned_long,bool>
          (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,RealCount> *this,
          NoThrowHeapAllocator *allocator,
          PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          *param1,unsigned_long param2,bool param3)

{
  long lVar1;
  NoThrowHeapAllocator *alloc;
  long *plVar2;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  local_68 = (undefined1  [8])&DListNode<Memory::SegmentBase<Memory::VirtualAllocWrapper>>::typeinfo
  ;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_10ee82;
  data.filename._0_4_ = 0x131;
  data._32_8_ = param2;
  alloc = Memory::NoThrowHeapAllocator::TrackAllocInfo(allocator,(TrackAllocData *)local_68);
  plVar2 = (long *)new<Memory::NoThrowHeapAllocator>(0x40,alloc,0x227794);
  Memory::SegmentBase<Memory::VirtualAllocWrapper>::SegmentBase
            ((SegmentBase<Memory::VirtualAllocWrapper> *)(plVar2 + 2),param1,data._32_8_,param3);
  lVar1 = *(long *)this;
  plVar2[1] = *(long *)(lVar1 + 8);
  *plVar2 = lVar1;
  **(undefined8 **)(lVar1 + 8) = plVar2;
  *(long **)(lVar1 + 8) = plVar2;
  *(int *)(this + 0x10) = *(int *)(this + 0x10) + 1;
  return (SegmentBase<Memory::VirtualAllocWrapper> *)(plVar2 + 2);
}

Assistant:

TData * PrependNode(TAllocator * allocator, TParam1 param1, TParam2 param2, TParam3 param3)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, param1, param2, param3);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }